

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.cpp
# Opt level: O1

int main(void)

{
  BadListener bl;
  ConsoleListener cr;
  Person p;
  IPersonListener local_60;
  IPersonListener local_58;
  Person local_50;
  
  local_50.m_age = 10;
  local_50.m_mtx.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  local_50.m_listeners.super__Vector_base<IPersonListener_*,_std::allocator<IPersonListener_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.m_listeners.super__Vector_base<IPersonListener_*,_std::allocator<IPersonListener_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.m_listeners.super__Vector_base<IPersonListener_*,_std::allocator<IPersonListener_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.m_mtx.super___recursive_mutex_base._M_mutex.__align = 0;
  local_50.m_mtx.super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  local_50.m_mtx.super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_50.m_mtx.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  local_58._vptr_IPersonListener = (_func_int **)&PTR__IPersonListener_00104ce0;
  local_60._vptr_IPersonListener = (_func_int **)&PTR__IPersonListener_00104d70;
  Person::subscribe(&local_50,&local_58);
  Person::set_age(&local_50,0xb);
  Person::set_age(&local_50,0xc);
  Person::subscribe(&local_50,&local_60);
  Person::set_age(&local_50,0xd);
  Person::unsubscribe(&local_50,&local_58);
  Person::set_age(&local_50,0x11);
  if (local_50.m_listeners.super__Vector_base<IPersonListener_*,_std::allocator<IPersonListener_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.m_listeners.
                    super__Vector_base<IPersonListener_*,_std::allocator<IPersonListener_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.m_listeners.
                          super__Vector_base<IPersonListener_*,_std::allocator<IPersonListener_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.m_listeners.
                          super__Vector_base<IPersonListener_*,_std::allocator<IPersonListener_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
	Person p(10);
	ConsoleListener cr;
	BadListener bl;
	p.subscribe(std::addressof(cr));
	p.set_age(11);
	p.set_age(12);
	p.subscribe(std::addressof(bl));
	p.set_age(13);
	p.unsubscribe(std::addressof(cr));
	p.set_age(17);

	return 0;
}